

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::obtain_storage(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                 *this,undefined8 *a,long n,size_t max_align)

{
  long lVar1;
  elem_ptr_pointer pvVar2;
  undefined8 *puVar3;
  void *pvVar4;
  Interface *pIVar5;
  elem_ptr_pointer pvVar6;
  void_pointer pvVar7;
  void_pointer pvVar8;
  elem_ptr_pointer __s;
  elem_ptr_pointer pvVar9;
  allocator<Interface> local_49;
  size_t local_48;
  undefined8 *local_40;
  elem_ptr_pointer local_38;
  
  this->_align_max = max_align;
  __s = (elem_ptr_pointer)*a;
  pvVar9 = (elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  pvVar2 = this->_free_elem;
  local_48 = max_align;
  local_40 = a;
  if (n != 0) {
    memset(__s,0,((n * 0x28 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  pvVar6 = __s + n;
  local_38 = pvVar6;
  if (pvVar9 != pvVar2) {
    lVar1 = local_48 - 1;
    do {
      (__s->
      super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
      ).
      super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
      .cf = (pvVar9->
            super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
            ).
            super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
            .cf;
      (__s->ptr).first = (pvVar9->ptr).first;
      (__s->ptr).second = (pvVar9->ptr).second;
      (__s->sf).first = (pvVar9->sf).first;
      (__s->sf).second = (pvVar9->sf).second;
      pvVar4 = (void *)((lVar1 - (ulong)(lVar1 + (long)pvVar6) % local_48) + (long)pvVar6);
      (__s->ptr).first = pvVar4;
      pIVar5 = (*(pvVar9->
                 super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
                 ).
                 super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
                 .cf)(&local_49,(pvVar9->ptr).second,pvVar4,Move);
      (__s->ptr).second = pIVar5;
      pvVar6 = (elem_ptr_pointer)((long)(__s->ptr).first + (__s->sf).first);
      pvVar9 = pvVar9 + 1;
      __s = __s + 1;
    } while (pvVar9 != pvVar2);
  }
  pvVar2 = this->_free_elem;
  pvVar9 = (elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  puVar3 = local_40;
  for (pvVar6 = pvVar9; local_40 = puVar3, pvVar2 != pvVar6; pvVar6 = pvVar6 + 1) {
    (*((pvVar6->ptr).second)->_vptr_Interface[3])();
    (pvVar6->ptr).second = (Interface *)0x0;
    (pvVar6->sf).first = 0;
    (pvVar6->
    super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
    ).
    super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
    .cf = (clone_func_ptr_t)0x0;
    (pvVar6->ptr).first = (void *)0x0;
    (pvVar6->sf).second = 0;
    puVar3 = local_40;
  }
  this->_free_elem = pvVar9;
  this->_align_max = 8;
  pvVar7 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  pvVar8 = pvVar7;
  if (((ulong)((long)this->_begin_storage - (long)pvVar7) / 5 & 0xfffffffffffffff8) * 5 != 0) {
    do {
      *(undefined8 *)((long)pvVar7 + 0x18) = 0;
      *(undefined8 *)((long)pvVar7 + 0x20) = 0;
      *(undefined8 *)((long)pvVar7 + 8) = 0;
      *(undefined8 *)((long)pvVar7 + 0x10) = 0;
      pvVar7 = (void_pointer)((long)pvVar7 + 0x28);
      pvVar8 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
    } while (pvVar7 != (void_pointer)
                       ((long)pvVar8 +
                       ((ulong)((long)this->_begin_storage - (long)pvVar8) / 0x28) * 0x28));
  }
  this->_free_elem = (elem_ptr_pointer)0x0;
  this->_begin_storage = (void_pointer)0x0;
  operator_delete(pvVar8,(long)(this->super_allocator_base<std::allocator<unsigned_char>_>).
                               _end_storage - (long)pvVar8);
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage = (void_pointer)0x0;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage = (void_pointer)0x0;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage = (void_pointer)*puVar3;
  *puVar3 = 0;
  pvVar7 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage =
       (void_pointer)puVar3[1];
  puVar3[1] = pvVar7;
  this->_free_elem = __s;
  this->_begin_storage = local_38;
  this->_align_max = local_48;
  return;
}

Assistant:

inline void vector<I, A, C>::obtain_storage(
    my_base&& a, size_t n, size_t max_align, std::false_type /*unused*/) noexcept
{
    _align_max = max_align;
    auto ret   = poly_uninitialized_move(
        a, a.storage(), begin_elem(), end_elem(), std::next(begin_elem(), n), max_align);
    tidy();
    base().swap(a);
    set_ptrs(ret);
    _align_max = max_align;
}